

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_paged_audio_buffer_data_allocate_and_append_page
                    (ma_paged_audio_buffer_data *pData,ma_uint32 pageSizeInFrames,void *pInitialData
                    ,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_paged_audio_buffer_page *pmVar1;
  ma_result mVar2;
  ma_paged_audio_buffer_page *pmVar3;
  bool bVar4;
  ma_paged_audio_buffer_page *pPage;
  ma_paged_audio_buffer_page *local_10;
  
  mVar2 = ma_paged_audio_buffer_data_allocate_page
                    (pData,(ulong)pageSizeInFrames,pInitialData,pAllocationCallbacks,&local_10);
  if ((mVar2 == MA_SUCCESS) &&
     (mVar2 = MA_INVALID_ARGS,
     local_10 != (ma_paged_audio_buffer_page *)0x0 && pData != (ma_paged_audio_buffer_data *)0x0)) {
    do {
      pmVar1 = pData->pTail;
      LOCK();
      pmVar3 = pData->pTail;
      bVar4 = pmVar1 == pmVar3;
      if (bVar4) {
        pData->pTail = local_10;
        pmVar3 = pmVar1;
      }
      UNLOCK();
    } while (!bVar4);
    LOCK();
    pmVar3->pNext = local_10;
    UNLOCK();
    mVar2 = MA_SUCCESS;
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_data_allocate_and_append_page(ma_paged_audio_buffer_data* pData, ma_uint32 pageSizeInFrames, const void* pInitialData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_result result;
    ma_paged_audio_buffer_page* pPage;

    result = ma_paged_audio_buffer_data_allocate_page(pData, pageSizeInFrames, pInitialData, pAllocationCallbacks, &pPage);
    if (result != MA_SUCCESS) {
        return result;
    }

    return ma_paged_audio_buffer_data_append_page(pData, pPage);    /* <-- Should never fail. */
}